

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem markbeingfnz(global_State *g)

{
  lu_mem lVar1;
  GCObject *o;
  
  o = g->tobefnz;
  if (o == (GCObject *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      if ((o->marked & 0x18) != 0) {
        if (9 < (o->tt & 0xe)) {
          __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x1b9,"lu_mem markbeingfnz(global_State *)");
        }
        reallymarkobject(g,o);
      }
      o = o->next;
      lVar1 = lVar1 + 1;
    } while (o != (GCObject *)0x0);
  }
  return lVar1;
}

Assistant:

static lu_mem markbeingfnz (global_State *g) {
  GCObject *o;
  lu_mem count = 0;
  for (o = g->tobefnz; o != NULL; o = o->next) {
    count++;
    markobject(g, o);
  }
  return count;
}